

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>::
initialize<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>
          (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>> *this,
          Animatable<std::vector<double,_std::allocator<double>_>_> *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>)0x1) {
    tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>::Animatable
              ((Animatable<std::vector<double,_std::allocator<double>_>_> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<std::vector<double,std::allocator<double>>>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<double>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<double>>, V = tinyusdz::Animatable<std::vector<double>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }